

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtpSession.cpp
# Opt level: O1

void __thiscall gnl::FtpSession::printOpendirErrorMesg(FtpSession *this)

{
  int iVar1;
  int *piVar2;
  char *__s;
  
  printf("Error openning directory \"%s\", error was:\n  ",
         (this->mWorkingDirectory)._M_dataplus._M_p);
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  if (iVar1 < 0xd) {
    if (iVar1 == 2) {
      __s = "Directory does not exist, or is an empty string.";
    }
    else {
      if (iVar1 != 0xc) {
LAB_00109491:
        printf("\"%s\" is not a directory.\n",(this->mWorkingDirectory)._M_dataplus._M_p);
        return;
      }
      __s = "Insufficient memory to complete the operation..";
    }
  }
  else if (iVar1 == 0x18) {
    __s = "Too many file descriptors in use by process.";
  }
  else if (iVar1 == 0x17) {
    __s = "Too many files are currently open in the system.";
  }
  else {
    if (iVar1 != 0xd) goto LAB_00109491;
    __s = "Access denied.";
  }
  puts(__s);
  return;
}

Assistant:

void FtpSession::printOpendirErrorMesg(){
        printf("Error openning directory \"%s\", error was:\n  ",mWorkingDirectory.c_str());
        switch(errno) {
            case EACCES:
                printf("Access denied.\n");
                break;
            case EMFILE:
                printf("Too many file descriptors in use by process.\n");
                break;
            case ENFILE:
                printf("Too many files are currently open in the system.\n");
                break;
            case ENOENT:
                printf("Directory does not exist, or is an empty string.\n");
                break;
            case ENOMEM:
                printf("Insufficient memory to complete the operation..\n");
                break ;
            case ENOTDIR:
            default:
                printf("\"%s\" is not a directory.\n",mWorkingDirectory.c_str());
                break ;
        }
    }